

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnOpcode(BinaryReaderObjdump *this,Opcode opcode)

{
  pointer *ppIVar1;
  pointer this_00;
  ulong uVar2;
  ulong uVar3;
  pointer pIVar4;
  long lVar5;
  ulong uVar6;
  size_t __n;
  
  (this->super_BinaryReaderObjdumpBase).current_opcode.enum_ = opcode.enum_;
  if (((this->reading_elem_init_expr_ == false) && (this->reading_data_init_expr_ == false)) &&
     (this->reading_global_init_expr_ == false)) {
    if ((this->reading_elem_expr_ & opcode.enum_ != End) == 0) {
      return (Result)Ok;
    }
  }
  else if (opcode.enum_ == End) {
    return (Result)Ok;
  }
  pIVar4 = (this->current_init_expr_).insts.
           super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar4 == (this->current_init_expr_).insts.
                super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_00 = (this->current_init_expr_).insts.
              super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)pIVar4 - (long)this_00;
    if (__n == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar2 = (long)__n / 0x18;
    uVar3 = 1;
    if (pIVar4 != this_00) {
      uVar3 = uVar2;
    }
    uVar6 = uVar3 + uVar2;
    if (0x555555555555554 < uVar6) {
      uVar6 = 0x555555555555555;
    }
    if (CARRY8(uVar3,uVar2)) {
      uVar6 = 0x555555555555555;
    }
    if (uVar6 == 0) {
      pIVar4 = (pointer)0x0;
    }
    else {
      pIVar4 = (pointer)operator_new(uVar6 * 0x18);
    }
    pIVar4[uVar2].opcode.enum_ = opcode.enum_;
    if (0 < (long)__n) {
      memmove(pIVar4,this_00,__n);
    }
    lVar5 = (long)(this->current_init_expr_).insts.
                  super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
    std::
    _Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
    ::_M_deallocate((_Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
                     *)this_00,(pointer)(lVar5 / 0x18),lVar5 % 0x18);
    (this->current_init_expr_).insts.
    super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
    ._M_impl.super__Vector_impl_data._M_start = pIVar4;
    (this->current_init_expr_).insts.
    super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pIVar4 + __n + 0x18);
    (this->current_init_expr_).insts.
    super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pIVar4 + uVar6;
  }
  else {
    *(Enum *)&(((_Vector_impl *)&pIVar4->opcode)->super__Vector_impl_data)._M_start = opcode.enum_;
    ppIVar1 = &(this->current_init_expr_).insts.
               super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnOpcode(Opcode opcode) {
  BinaryReaderObjdumpBase::OnOpcode(opcode);
  if (ReadingInitExpr() && opcode != Opcode::End) {
    InitInst i;
    i.opcode = current_opcode;
    current_init_expr_.insts.push_back(i);
  }
  return Result::Ok;
}